

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O3

bool CheckBossDeath(AActor *actor)

{
  int iVar1;
  int *piVar2;
  AActor *pAVar3;
  undefined4 extraout_var;
  PClass *pPVar5;
  long lVar6;
  TThinkerIterator<AActor> iterator;
  FThinkerIterator local_40;
  PClass *pPVar4;
  undefined4 extraout_var_00;
  
  piVar2 = &DAT_017e1ed8;
  lVar6 = 0;
  while ((playeringame[lVar6] != true || (*piVar2 < 1))) {
    lVar6 = lVar6 + 1;
    piVar2 = piVar2 + 0xa8;
    if (lVar6 == 8) {
      return false;
    }
  }
  FThinkerIterator::FThinkerIterator(&local_40,AActor::RegistrationInfo.MyClass,0x80);
  pAVar3 = (AActor *)FThinkerIterator::Next(&local_40,false);
  if (pAVar3 == (AActor *)0x0) {
    return true;
  }
  do {
    if ((pAVar3 != actor) && ((0 < pAVar3->health || ((int)(pAVar3->flags).Value < 0)))) {
      pPVar4 = (pAVar3->super_DThinker).super_DObject.Class;
      if (pPVar4 == (PClass *)0x0) {
        iVar1 = (**(pAVar3->super_DThinker).super_DObject._vptr_DObject)(pAVar3);
        pPVar4 = (PClass *)CONCAT44(extraout_var,iVar1);
        (pAVar3->super_DThinker).super_DObject.Class = pPVar4;
      }
      pPVar5 = (actor->super_DThinker).super_DObject.Class;
      if (pPVar5 == (PClass *)0x0) {
        iVar1 = (**(actor->super_DThinker).super_DObject._vptr_DObject)(actor);
        pPVar5 = (PClass *)CONCAT44(extraout_var_00,iVar1);
        (actor->super_DThinker).super_DObject.Class = pPVar5;
      }
      if (pPVar4 == pPVar5) {
        return false;
      }
    }
    pAVar3 = (AActor *)FThinkerIterator::Next(&local_40,false);
    if (pAVar3 == (AActor *)0x0) {
      return true;
    }
  } while( true );
}

Assistant:

bool CheckBossDeath (AActor *actor)
{
	int i;

	// make sure there is a player alive for victory
	for (i = 0; i < MAXPLAYERS; i++)
		if (playeringame[i] && players[i].health > 0)
			break;
	
	if (i == MAXPLAYERS)
		return false; // no one left alive, so do not end game
	
	// Make sure all bosses are dead
	TThinkerIterator<AActor> iterator;
	AActor *other;

	while ( (other = iterator.Next ()) )
	{
		if (other != actor &&
			(other->health > 0 || (other->flags & MF_ICECORPSE))
			&& other->GetClass() == actor->GetClass())
		{ // Found a living boss
		  // [RH] Frozen bosses don't count as dead until they shatter
			return false;
		}
	}
	// The boss death is good
	return true;
}